

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBGetProgramResourceAPITest *this,GLuint test_case_index)

{
  CASES CVar1;
  reference pvVar2;
  ostream *poVar3;
  GLchar *pGVar4;
  TestError *this_00;
  test_Case *test_case;
  stringstream stream;
  ostream local_198;
  uint local_1c;
  XFBGetProgramResourceAPITest *pXStack_18;
  GLuint test_case_index_local;
  XFBGetProgramResourceAPITest *this_local;
  
  local_1c = test_case_index;
  pXStack_18 = this;
  this_local = (XFBGetProgramResourceAPITest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&test_case);
  pvVar2 = std::
           vector<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case,_std::allocator<gl4cts::EnhancedLayouts::XFBGetProgramResourceAPITest::test_Case>_>
           ::operator[](&this->m_test_cases,(ulong)local_1c);
  poVar3 = std::operator<<(&local_198,"Stage: ");
  pGVar4 = Utils::Shader::GetStageName(pvVar2->m_stage);
  poVar3 = std::operator<<(poVar3,pGVar4);
  poVar3 = std::operator<<(poVar3,", type: ");
  pGVar4 = Utils::Type::GetGLSLTypeName(&pvVar2->m_type);
  poVar3 = std::operator<<(poVar3,pGVar4);
  std::operator<<(poVar3,", case: ");
  CVar1 = pvVar2->m_case;
  if (CVar1 == INTERLEAVED) {
    std::operator<<(&local_198,"interleaved");
  }
  else if (CVar1 == SEPARATED) {
    std::operator<<(&local_198,"separated");
  }
  else {
    if (CVar1 != XFB) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x578b);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::operator<<(&local_198,"xfb");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&test_case);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBGetProgramResourceAPITest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	const test_Case&  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << ", type: " << test_case.m_type.GetGLSLTypeName() << ", case: ";

	switch (test_case.m_case)
	{
	case INTERLEAVED:
		stream << "interleaved";
		break;
	case SEPARATED:
		stream << "separated";
		break;
	case XFB:
		stream << "xfb";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}